

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

filepos_t UpdateDataSizeTrackEntry
                    (matroska_trackentry *Element,bool_t bWithDefault,bool_t bForceWithoutMandatory,
                    int ForProfile)

{
  ebml_element *peVar1;
  bool_t Element_00;
  ebml_context *peVar2;
  ebml_master *peVar3;
  ulong uVar4;
  int64_t iVar5;
  err_t eVar6;
  void *pvVar7;
  filepos_t fVar8;
  undefined1 local_98 [8];
  array Compressed_1;
  size_t Offset;
  size_t CompressedSize_1;
  uint8_t *NewCompressed;
  uint8_t *Compressed;
  size_t CompressedSize;
  ebml_binary *CodecPrivate;
  ebml_element *Header;
  ebml_element *Elt;
  ebml_element *Elt2;
  ebml_element *Encodings;
  ebml_integer *Scope;
  MatroskaTrackEncodingCompAlgo CompressionAlgo;
  int ForProfile_local;
  bool_t bForceWithoutMandatory_local;
  bool_t bWithDefault_local;
  matroska_trackentry *Element_local;
  
  Scope._0_4_ = -1;
  Encodings = (ebml_element *)0x0;
  Scope._4_4_ = ForProfile;
  _CompressionAlgo = bForceWithoutMandatory;
  bForceWithoutMandatory_local = bWithDefault;
  bWithDefault_local = (bool_t)Element;
  peVar2 = MATROSKA_getContextContentEncodings();
  peVar3 = (ebml_master *)EBML_MasterFindFirstElt(&Element->Base,peVar2,0,0,0);
  Elt2 = (ebml_element *)peVar3;
  if (peVar3 != (ebml_master *)0x0) {
    peVar2 = MATROSKA_getContextContentEncoding();
    peVar3 = (ebml_master *)EBML_MasterFindFirstElt(peVar3,peVar2,0,0,0);
    Elt = (ebml_element *)peVar3;
    if (peVar3 != (ebml_master *)0x0) {
      peVar2 = MATROSKA_getContextContentCompression();
      Header = EBML_MasterFindFirstElt(peVar3,peVar2,0,0,0);
      peVar1 = Elt;
      if (Header != (ebml_element *)0x0) {
        peVar2 = MATROSKA_getContextContentEncodingScope();
        Encodings = EBML_MasterFindFirstElt((ebml_master *)peVar1,peVar2,0,0,0);
        if (((ebml_integer *)Encodings != (ebml_integer *)0x0) &&
           (uVar4 = EBML_IntegerValue((ebml_integer *)Encodings), peVar1 = Header, (uVar4 & 2) != 0)
           ) {
          peVar2 = MATROSKA_getContextContentCompAlgo();
          CodecPrivate = (ebml_binary *)
                         EBML_MasterFindFirstElt((ebml_master *)peVar1,peVar2,1,1,Scope._4_4_);
          iVar5 = EBML_IntegerValue((ebml_integer *)CodecPrivate);
          Scope._0_4_ = (int)iVar5;
        }
      }
    }
  }
  Element_00 = bWithDefault_local;
  if ((int)Scope != *(int *)(bWithDefault_local + 0x70)) {
    peVar2 = MATROSKA_getContextCodecPrivate();
    CompressedSize = (size_t)EBML_MasterFindFirstElt((ebml_master *)Element_00,peVar2,0,0,0);
    if (*(int *)(bWithDefault_local + 0x70) == -1) {
      if ((ebml_element *)CompressedSize != (ebml_element *)0x0) {
        if ((ebml_element *)CompressedSize == (ebml_element *)0xffffffffffffff98) {
          __assert_fail("&(CodecPrivate->Data)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x8ec,
                        "filepos_t UpdateDataSizeTrackEntry(matroska_trackentry *, bool_t, bool_t, int)"
                       );
        }
        Compressed = (uint8_t *)(((ebml_element *)(CompressedSize + 0x68))->Base).Base.VMT;
        CompressedSize_1 = (size_t)malloc((size_t)Compressed);
        NewCompressed = (uint8_t *)CompressedSize_1;
        if ((int)Scope == 0) {
          if (CompressedSize == 0xffffffffffffff98) {
            __assert_fail("&(CodecPrivate->Data)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x8f1,
                          "filepos_t UpdateDataSizeTrackEntry(matroska_trackentry *, bool_t, bool_t, int)"
                         );
          }
          eVar6 = CompressFrameZLib(*(uint8_t **)(CompressedSize + 0x68),
                                    *(size_t *)(CompressedSize + 0x38),(uint8_t **)&CompressedSize_1
                                    ,(size_t *)&Compressed);
          if ((eVar6 == 0) &&
             (eVar6 = EBML_BinarySetData((ebml_binary *)CompressedSize,(uint8_t *)CompressedSize_1,
                                         (size_t)Compressed), eVar6 == 0)) {
            *(undefined4 *)(bWithDefault_local + 0x70) = 0;
          }
        }
        free(NewCompressed);
      }
      peVar1 = Encodings;
      if (*(int *)(bWithDefault_local + 0x70) == -1) {
        uVar4 = EBML_IntegerValue((ebml_integer *)Encodings);
        EBML_IntegerSetValue((ebml_integer *)peVar1,uVar4 ^ 2);
      }
    }
    else if ((ebml_element *)CompressedSize == (ebml_element *)0x0) {
      *(undefined4 *)(bWithDefault_local + 0x70) = 0xffffffff;
    }
    else {
      if ((ebml_element *)CompressedSize == (ebml_element *)0xffffffffffffff98) {
        __assert_fail("&(CodecPrivate->Data)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x900,
                      "filepos_t UpdateDataSizeTrackEntry(matroska_trackentry *, bool_t, bool_t, int)"
                     );
      }
      Offset = (size_t)(((ebml_element *)(CompressedSize + 0x68))->Base).Base.VMT;
      Compressed_1._Used = 0;
      Element_local = (matroska_trackentry *)local_98;
      local_98 = (undefined1  [8])0x0;
      Compressed_1._Begin = (char *)0x0;
      if (*(int *)(bWithDefault_local + 0x70) == 0) {
        if ((ebml_element *)CompressedSize == (ebml_element *)0xffffffffffffff98) {
          __assert_fail("&(CodecPrivate->Data)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x907,
                        "filepos_t UpdateDataSizeTrackEntry(matroska_trackentry *, bool_t, bool_t, int)"
                       );
        }
        eVar6 = UnCompressFrameZLib(*(uint8_t **)
                                     &(((ebml_element *)(CompressedSize + 0x68))->Base).Base,
                                    ((ebml_element *)CompressedSize)->DataSize,(array *)local_98,
                                    &Offset,&Compressed_1._Used);
        if ((eVar6 == 0) &&
           (eVar6 = EBML_BinarySetData((ebml_binary *)CompressedSize,(uint8_t *)local_98,Offset),
           eVar6 == 0)) {
          *(undefined4 *)(bWithDefault_local + 0x70) = 0xffffffff;
        }
      }
      ArrayClear((array *)local_98);
    }
  }
  pvVar7 = Node_InheritedVMT((node *)bWithDefault_local,0x45544b4d);
  fVar8 = (**(code **)((long)pvVar7 + 0x98))
                    (bWithDefault_local,bForceWithoutMandatory_local,_CompressionAlgo,Scope._4_4_);
  return fVar8;
}

Assistant:

static filepos_t UpdateDataSizeTrackEntry(matroska_trackentry *Element, bool_t bWithDefault, bool_t bForceWithoutMandatory, int ForProfile)
{
    MatroskaTrackEncodingCompAlgo CompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
    ebml_integer *Scope = NULL;
    ebml_element *Encodings = EBML_MasterFindChild(Element,MATROSKA_getContextContentEncodings());
    if (Encodings)
    {
        ebml_element *Elt2 = EBML_MasterFindChild((ebml_master*)Encodings,MATROSKA_getContextContentEncoding());
        if (Elt2)
        {
            ebml_element *Elt =  EBML_MasterFindChild((ebml_master*)Elt2,MATROSKA_getContextContentCompression());
            if (Elt)
            {
                Scope = (ebml_integer*)EBML_MasterFindChild((ebml_master*)Elt2,MATROSKA_getContextContentEncodingScope());
                if (Scope && (EBML_IntegerValue(Scope) & MATROSKA_CONTENTENCODINGSCOPE_PRIVATE)!=0)
                {
                    ebml_element *Header = EBML_MasterGetChild((ebml_master*)Elt, MATROSKA_getContextContentCompAlgo(),ForProfile);
                    CompressionAlgo = EBML_IntegerValue((ebml_integer*)Header);
                }
            }
        }
    }

    if (CompressionAlgo != Element->CodecPrivateCompressionAlgo)
    {
        ebml_binary *CodecPrivate = (ebml_binary*)EBML_MasterFindChild(Element,MATROSKA_getContextCodecPrivate());
        if (Element->CodecPrivateCompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_NONE)
        {
            // compress the codec private
            if (CodecPrivate)
            {
                size_t CompressedSize = ARRAYCOUNT(CodecPrivate->Data,uint8_t);
                uint8_t *Compressed = malloc(CompressedSize);
                uint8_t *NewCompressed = Compressed;
#if defined(CONFIG_ZLIB)
                if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB &&
                    CompressFrameZLib(ARRAYBEGIN(CodecPrivate->Data,uint8_t), (size_t)CodecPrivate->Base.DataSize, &NewCompressed, &CompressedSize)==ERR_NONE)
                {
                    if (EBML_BinarySetData(CodecPrivate, NewCompressed, CompressedSize)==ERR_NONE)
                        Element->CodecPrivateCompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_ZLIB;
                }
#endif
                free(Compressed);
            }
            if (Element->CodecPrivateCompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_NONE)
                EBML_IntegerSetValue(Scope, EBML_IntegerValue(Scope) ^ MATROSKA_CONTENTENCODINGSCOPE_PRIVATE);
        }
        else
        {
            if (CodecPrivate)
            {
                size_t CompressedSize = ARRAYCOUNT(CodecPrivate->Data,uint8_t);
                size_t Offset = 0;
                array Compressed;

                ArrayInit(&Compressed);
#if defined(CONFIG_ZLIB)
                if (Element->CodecPrivateCompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB &&
                    UnCompressFrameZLib(ARRAYBEGIN(CodecPrivate->Data,uint8_t), (size_t)CodecPrivate->Base.DataSize, &Compressed, &CompressedSize, &Offset)==ERR_NONE)
                {
                    if (EBML_BinarySetData(CodecPrivate, ARRAYBEGIN(Compressed,uint8_t), CompressedSize)==ERR_NONE)
                        Element->CodecPrivateCompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
                }
#endif
                ArrayClear(&Compressed);
            }
            else
                Element->CodecPrivateCompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
            if (Element->CodecPrivateCompressionAlgo != MATROSKA_TRACK_ENCODING_COMP_NONE)
            {
                // TODO: add in the Compression header that the header is still compressed
            }
        }
    }
    return INHERITED(Element,ebml_element_vmt,MATROSKA_TRACKENTRY_CLASS)->UpdateDataSize(Element, bWithDefault, bForceWithoutMandatory, ForProfile);
}